

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

GeometryShaderExecutor *
deqp::gls::ShaderExecUtil::GeometryShaderExecutor::create
          (RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  bool bVar1;
  GeometryShaderExecutor *this;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = glu::glslVersionIsES(shaderSpec->version);
  if ((bVar1) && ((int)shaderSpec->version < 3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_EXT_geometry_shader",&local_39);
    checkExtension(renderCtx,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  this = (GeometryShaderExecutor *)operator_new(0x158);
  GeometryShaderExecutor(this,renderCtx,shaderSpec);
  return this;
}

Assistant:

GeometryShaderExecutor* GeometryShaderExecutor::create (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
{
	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		checkExtension(renderCtx, "GL_EXT_geometry_shader");

	return new GeometryShaderExecutor(renderCtx, shaderSpec);
}